

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O3

XXH64_hash_t XXH3_64bits_digest(XXH3_state_t *state)

{
  XXH64_hash_t XVar1;
  xxh_u8 *secret;
  size_t secretLen;
  code *f_hashLong;
  XXH64_hash_t acc [8];
  XXH64_hash_t aXStack_58 [8];
  
  secret = state->customSecret;
  if (state->extSecret != (uchar *)0x0) {
    secret = state->extSecret;
  }
  if (0xf0 < state->totalLen) {
    XXH3_digest_long(aXStack_58,state,secret);
    XVar1 = XXH3_mergeAccs(aXStack_58,secret + 0xb,state->totalLen * -0x61c8864e7a143579);
    return XVar1;
  }
  if (state->useSeed == 0) {
    secretLen = state->secretLimit + 0x40;
    f_hashLong = XXH3_hashLong_64b_withSecret;
    XVar1 = 0;
  }
  else {
    XVar1 = state->seed;
    secret = XXH3_kSecret;
    f_hashLong = XXH3_hashLong_64b_withSeed;
    secretLen = 0xc0;
  }
  XVar1 = XXH3_64bits_internal(state->buffer,state->totalLen,XVar1,secret,secretLen,f_hashLong);
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t XXH3_64bits_digest (XXH_NOESCAPE const XXH3_state_t* state)
{
    const unsigned char* const secret = (state->extSecret == NULL) ? state->customSecret : state->extSecret;
    if (state->totalLen > XXH3_MIDSIZE_MAX) {
        XXH_ALIGN(XXH_ACC_ALIGN) XXH64_hash_t acc[XXH_ACC_NB];
        XXH3_digest_long(acc, state, secret);
        return XXH3_mergeAccs(acc,
                              secret + XXH_SECRET_MERGEACCS_START,
                              (xxh_u64)state->totalLen * XXH_PRIME64_1);
    }
    /* totalLen <= XXH3_MIDSIZE_MAX: digesting a short input */
    if (state->useSeed)
        return XXH3_64bits_withSeed(state->buffer, (size_t)state->totalLen, state->seed);
    return XXH3_64bits_withSecret(state->buffer, (size_t)(state->totalLen),
                                  secret, state->secretLimit + XXH_STRIPE_LEN);
}